

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c.h
# Opt level: O1

void print_literal_cold_1(void)

{
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c.h"
          ,0xf1,"internal error: unexpected type during code generation");
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c.h"
                ,0xf1,"const char *scalar_cast(fb_scalar_type_t)");
}

Assistant:

static inline const char *scalar_cast(fb_scalar_type_t scalar_type)
{
    const char *cast;
    switch (scalar_type) {
    case fb_ulong:
        cast = "UINT64_C";
        break;
    case fb_uint:
        cast = "UINT32_C";
        break;
    case fb_ushort:
        cast = "UINT16_C";
        break;
    case fb_char:
        cast = "char";
        break;
    case fb_ubyte:
        cast = "UINT8_C";
        break;
    case fb_bool:
        cast = "UINT8_C";
        break;
    case fb_long:
        cast = "INT64_C";
        break;
    case fb_int:
        cast = "INT32_C";
        break;
    case fb_short:
        cast = "INT16_C";
        break;
    case fb_byte:
        cast = "INT8_C";
        break;
    default:
        gen_panic(0, "internal error: unexpected type during code generation");
        cast = "";
        break;
    }
    return cast;
}